

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::DecodeRawTransactionResponse::~DecodeRawTransactionResponse
          (DecodeRawTransactionResponse *this)

{
  DecodeRawTransactionResponse *in_RDI;
  
  ~DecodeRawTransactionResponse(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~DecodeRawTransactionResponse() {
    // do nothing
  }